

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
* cpsm::Matcher<cpsm::NonPathTraits,_cpsm::Utf8StringTraits>::find_word_endings
            (Iterator first,Iterator last)

{
  bool bVar1;
  bool bVar2;
  char32_t *in_RSI;
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  *in_RDI;
  bool next_alphanumeric;
  bool next_uppercase;
  char32_t c;
  Iterator it;
  bool prev_alphanumeric;
  bool prev_uppercase;
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  *word_ends;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  *this;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> local_28;
  byte local_1b;
  byte local_1a;
  undefined1 local_19;
  char32_t *local_10;
  
  local_19 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::
  vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
  ::vector((vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
            *)0x16f32a);
  local_1a = 0;
  local_1b = 0;
  local_28._M_current = local_10;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff9f,
                                        CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98
                                                ))), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
    operator*(&local_28);
    bVar1 = Utf8StringTraits::is_uppercase(L'\0');
    in_stack_ffffffffffffff9f = bVar1;
    bVar2 = Utf8StringTraits::is_alphanumeric(L'\0');
    in_stack_ffffffffffffff9e = bVar2;
    if (((local_1b & 1) != 0) && ((!bVar2 || (((local_1a & 1) == 0 && (bVar1)))))) {
      __gnu_cxx::
      __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
      operator-((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                 *)this,(difference_type)in_RDI);
      std::
      vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
      ::push_back(in_RDI,(value_type *)
                         CONCAT17(in_stack_ffffffffffffff9f,
                                  CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
    }
    local_1b = bVar2;
    local_1a = bVar1;
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
    operator++(&local_28);
  }
  if ((local_1b & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
    operator-((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
               *)this,(difference_type)in_RDI);
    std::
    vector<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
    ::push_back(in_RDI,(value_type *)
                       CONCAT17(in_stack_ffffffffffffff9f,
                                CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
  }
  return this;
}

Assistant:

static std::vector<Iterator> find_word_endings(Iterator const first,
                                                 Iterator const last) {
    std::vector<Iterator> word_ends;
    bool prev_uppercase = false;
    bool prev_alphanumeric = false;
    for (auto it = first; it != last; ++it) {
      auto const c = *it;
      bool const next_uppercase = StringTraits::is_uppercase(c);
      bool const next_alphanumeric = StringTraits::is_alphanumeric(c);
      if (prev_alphanumeric &&
          (!next_alphanumeric || (!prev_uppercase && next_uppercase))) {
        word_ends.push_back(it - 1);
      }
      prev_uppercase = next_uppercase;
      prev_alphanumeric = next_alphanumeric;
    }
    if (prev_alphanumeric) {
      word_ends.push_back(last - 1);
    }
    return word_ends;
  }